

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::pid_formatter<spdlog::details::scoped_padder>::format
          (pid_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  undefined1 local_58 [8];
  scoped_padder p;
  uint field_size;
  uint32_t pid;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *param_1_local;
  pid_formatter<spdlog::details::scoped_padder> *this_local;
  
  p.spaces_.size_._4_4_ = os::pid();
  p.spaces_.size_._0_4_ = scoped_padder::count_digits<unsigned_int>(p.spaces_.size_._4_4_);
  scoped_padder::scoped_padder
            ((scoped_padder *)local_58,(ulong)(uint)p.spaces_.size_,
             &(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::append_int<unsigned_int>(p.spaces_.size_._4_4_,dest);
  scoped_padder::~scoped_padder((scoped_padder *)local_58);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = ScopedPadder::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }